

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  char *pkgloc_local;
  string loc;
  cmAlphaNum local_70;
  string local_40;
  
  pkgloc_local = pkgloc;
  cmGeneratorTarget::GetMacContentDirectory(&local_40,this->GT,config,RuntimeBinaryArtifact);
  loc._M_dataplus._M_p = (pointer)local_40._M_string_length;
  loc._M_string_length = (size_type)local_40._M_dataplus._M_p;
  local_70.View_._M_str = local_70.Digits_;
  local_70.View_._M_len = 1;
  local_70.Digits_[0] = '/';
  cmStrCat<char_const*>(__return_storage_ptr__,(cmAlphaNum *)&loc,&local_70,&pkgloc_local);
  std::__cxx11::string::~string((string *)&local_40);
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&loc,pkgloc_local,(allocator<char> *)&local_70);
  std::__cxx11::string::find((char)&loc,0x2f);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)&loc);
  std::__cxx11::string::operator=((string *)&loc,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&loc);
  std::__cxx11::string::~string((string *)&loc);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}